

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# childgenerator.cpp
# Opt level: O2

string * __thiscall
ChildGenerator::generateCode_abi_cxx11_(string *__return_storage_ptr__,ChildGenerator *this)

{
  int fieldIndex;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (fieldIndex = 0; fieldIndex < this->numFields_; fieldIndex = fieldIndex + 1) {
    handleFieldGeneration_abi_cxx11_(&local_40,this,fieldIndex);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ChildGenerator::generateCode() {
  std::string code;

  for(int i = 0; i < numFields_; i++) {
    code += handleFieldGeneration(i);
  }

  return code;
}